

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

void Abc_NtkRecDumpTt3(char *pFileName,int fBinary)

{
  ulong *puVar1;
  uint uVar2;
  uint nVars;
  undefined1 auVar3 [16];
  Lms_Man_t *pLVar4;
  FILE *__stream;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  Vec_Mem_t *pVVar7;
  ulong uVar8;
  void *__base;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  char cVar21;
  size_t sVar22;
  word *pTruth;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  char pBuffer [1000];
  char local_418 [1000];
  long lVar25;
  
  pLVar4 = s_pMan3;
  uVar2 = s_pMan3->vTtMem->nEntries;
  if ((ulong)uVar2 == 0) {
    pcVar6 = "There is not truth tables.";
  }
  else {
    nVars = s_pMan3->nVars;
    __stream = fopen(pFileName,"wb");
    if (__stream != (FILE *)0x0) {
      pVVar5 = (Vec_Str_t *)malloc(0x10);
      uVar10 = 0x10;
      if (0x10 < uVar2) {
        uVar10 = uVar2;
      }
      pVVar5->nSize = 0;
      pVVar5->nCap = uVar10;
      pcVar6 = (char *)malloc((long)(int)uVar10);
      pVVar5->pArray = pcVar6;
      pLVar4->vSupps = pVVar5;
      pVVar7 = pLVar4->vTtMem;
      if (0 < pVVar7->nEntries) {
        iVar13 = nVars - 6;
        uVar11 = 1 << ((byte)iVar13 & 0x1f);
        uVar20 = 1;
        if (1 < (int)uVar11) {
          uVar20 = (ulong)uVar11;
        }
        uVar14 = 0;
        do {
          if (pVVar7->ppPages[uVar14 >> ((byte)pVVar7->LogPageSze & 0x1f)] == (word *)0x0) break;
          if ((int)nVars < 1) {
            cVar21 = '\0';
          }
          else {
            puVar1 = pVVar7->ppPages[uVar14 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                     (int)((pVVar7->PageMask & uVar14) * pVVar7->nEntrySize);
            uVar8 = 0;
            cVar21 = '\0';
            do {
              if (nVars < 7) {
                if ((s_Truths6Neg[uVar8] &
                    (*puVar1 >> ((byte)(1 << ((byte)uVar8 & 0x1f)) & 0x3f) ^ *puVar1)) != 0) {
LAB_002fcb5e:
                  cVar21 = cVar21 + '\x01';
                }
              }
              else if (uVar8 < 6) {
                if (iVar13 != 0x1f) {
                  uVar16 = 0;
                  do {
                    if (((puVar1[uVar16] >> ((byte)(1 << ((byte)uVar8 & 0x1f)) & 0x3f) ^
                         puVar1[uVar16]) & s_Truths6Neg[uVar8]) != 0) goto LAB_002fcb5e;
                    uVar16 = uVar16 + 1;
                  } while (uVar20 != uVar16);
                }
              }
              else if (iVar13 != 0x1f) {
                bVar9 = (byte)(uVar8 - 6);
                uVar12 = 1 << (bVar9 & 0x1f);
                iVar15 = 2 << (bVar9 & 0x1f);
                uVar16 = 1;
                if (1 < (int)uVar12) {
                  uVar16 = (ulong)uVar12;
                }
                puVar17 = puVar1 + (int)uVar12;
                puVar18 = puVar1;
                do {
                  if (uVar8 - 6 != 0x1f) {
                    uVar19 = 0;
                    do {
                      if (puVar18[uVar19] != puVar17[uVar19]) goto LAB_002fcb5e;
                      uVar19 = uVar19 + 1;
                    } while (uVar16 != uVar19);
                  }
                  puVar18 = puVar18 + iVar15;
                  puVar17 = puVar17 + iVar15;
                } while (puVar18 < puVar1 + (int)uVar11);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != nVars);
          }
          pVVar5 = pLVar4->vSupps;
          uVar12 = pVVar5->nSize;
          if (uVar12 == pVVar5->nCap) {
            if ((int)uVar12 < 0x10) {
              if (pVVar5->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
              }
              pVVar5->pArray = pcVar6;
              pVVar5->nCap = 0x10;
            }
            else {
              sVar22 = (ulong)uVar12 * 2;
              if (pVVar5->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar22);
              }
              else {
                pcVar6 = (char *)realloc(pVVar5->pArray,sVar22);
              }
              pVVar5->pArray = pcVar6;
              pVVar5->nCap = (int)sVar22;
            }
          }
          else {
            pcVar6 = pVVar5->pArray;
          }
          iVar15 = pVVar5->nSize;
          pVVar5->nSize = iVar15 + 1;
          pcVar6[iVar15] = cVar21;
          uVar14 = uVar14 + 1;
          pVVar7 = pLVar4->vTtMem;
        } while ((int)uVar14 < pVVar7->nEntries);
      }
      __base = malloc((long)(int)uVar10 << 2);
      auVar3 = _DAT_0093d220;
      if (0 < (int)uVar2) {
        lVar25 = (ulong)uVar2 - 1;
        auVar23._8_4_ = (int)lVar25;
        auVar23._0_8_ = lVar25;
        auVar23._12_4_ = (int)((ulong)lVar25 >> 0x20);
        uVar20 = 0;
        auVar23 = auVar23 ^ _DAT_0093d220;
        auVar24 = _DAT_0093d210;
        do {
          auVar26 = auVar24 ^ auVar3;
          if ((bool)(~(auVar26._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar26._0_4_ ||
                      auVar23._4_4_ < auVar26._4_4_) & 1)) {
            *(int *)((long)__base + uVar20 * 4) = (int)uVar20;
          }
          if ((auVar26._12_4_ != auVar23._12_4_ || auVar26._8_4_ <= auVar23._8_4_) &&
              auVar26._12_4_ <= auVar23._12_4_) {
            *(int *)((long)__base + uVar20 * 4 + 4) = (int)uVar20 + 1;
          }
          uVar20 = uVar20 + 2;
          lVar25 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 2;
          auVar24._8_8_ = lVar25 + 2;
        } while ((uVar2 + 1 & 0xfffffffe) != uVar20);
      }
      qsort(__base,(long)(int)uVar2,4,Abc_NtkRecTruthCompare);
      pVVar5 = pLVar4->vSupps;
      if (pVVar5 != (Vec_Str_t *)0x0) {
        if (pVVar5->pArray != (char *)0x0) {
          free(pVVar5->pArray);
          pLVar4->vSupps->pArray = (char *)0x0;
          pVVar5 = pLVar4->vSupps;
          if (pVVar5 == (Vec_Str_t *)0x0) goto LAB_002fcda8;
        }
        free(pVVar5);
        pLVar4->vSupps = (Vec_Str_t *)0x0;
      }
LAB_002fcda8:
      if ((int)uVar2 < 1) {
        fclose(__stream);
        if (__base == (void *)0x0) {
          return;
        }
      }
      else {
        sVar22 = 0;
        do {
          uVar10 = *(uint *)((long)__base + sVar22 * 4);
          if (((int)uVar10 < 0) || (pVVar7 = pLVar4->vTtMem, pVVar7->nEntries <= (int)uVar10)) {
            __assert_fail("i >= 0 && i < p->nEntries",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                          ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
          }
          pTruth = pVVar7->ppPages[uVar10 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                   (long)(int)(pVVar7->PageMask & uVar10) * (long)pVVar7->nEntrySize;
          if (fBinary == 0) {
            Extra_PrintHex((FILE *)__stream,(uint *)pTruth,nVars);
            fwrite("  ",2,1,__stream);
            Dau_DsdDecompose(pTruth,pLVar4->nVars,0,(uint)((int)nVars < 0xb),local_418);
            fprintf(__stream,"%s\n",local_418);
          }
          else {
            fwrite(pTruth,1,(long)pLVar4->nWords << 3,__stream);
          }
          sVar22 = sVar22 + 1;
        } while ((long)(int)uVar2 != sVar22);
        fclose(__stream);
      }
      free(__base);
      return;
    }
    pcVar6 = "The file cannot be opened.";
  }
  puts(pcVar6);
  return;
}

Assistant:

void Abc_NtkRecDumpTt3( char * pFileName, int fBinary )
{
    FILE * pFile;
    char pBuffer[1000];
    Lms_Man_t * p = s_pMan3;
    Vec_Int_t * vEntries;
    word * pTruth;
    int i, Entry, nVars = p->nVars;
    int nEntries = Vec_MemEntryNum(p->vTtMem);
    if ( nEntries == 0 )
    {
        printf( "There is not truth tables.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "The file cannot be opened.\n" );
        return;
    }
    p->vSupps = Vec_StrAlloc( nEntries );
    Vec_MemForEachEntry( p->vTtMem, pTruth, i )
        Vec_StrPush( p->vSupps, (char)Abc_TtSupportSize(pTruth, nVars) );
    vEntries = Vec_IntStartNatural( nEntries );
    qsort( (void *)Vec_IntArray(vEntries), (size_t)nEntries, sizeof(int), (int(*)(const void *,const void *))Abc_NtkRecTruthCompare );
    Vec_StrFreeP( &p->vSupps );
    // write the file
    Vec_IntForEachEntry( vEntries, Entry, i )
    {
        pTruth = Vec_MemReadEntry(p->vTtMem, Entry);
        if ( fBinary )
        {
            fwrite( pTruth, 1, sizeof(word) * p->nWords, pFile );
            continue;
        }
        Extra_PrintHex( pFile, (unsigned *)pTruth, nVars );
        fprintf( pFile, "  " );
//        Kit_DsdWriteFromTruth( pBuffer, (unsigned *)pTruth, nVars );
        Dau_DsdDecompose( pTruth, p->nVars, 0, (int)(nVars <= 10), pBuffer );
        fprintf( pFile, "%s\n", pBuffer );
    }
    fclose( pFile );
    Vec_IntFree( vEntries );
}